

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O2

bool jhu::thrax::isConsistent(Alignment *a,SpanPair sp)

{
  Point *pPVar1;
  bool bVar2;
  __normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
  __it;
  long lVar3;
  long lVar4;
  __normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
  _Var5;
  long local_40;
  IndexType local_38;
  
  __it._M_current =
       (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pPVar1 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_40 = (long)sp << 0x10;
  local_38 = sp.tgt.end;
  lVar4 = (long)pPVar1 - (long)__it._M_current;
  for (lVar3 = lVar4 >> 4; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::$_0>
            ::operator()((_Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                          *)&local_40,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_00109118;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::$_0>
            ::operator()((_Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                          *)&local_40,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_00109118;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::$_0>
            ::operator()((_Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                          *)&local_40,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_00109118;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::$_0>
            ::operator()((_Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                          *)&local_40,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_00109118;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x10;
  }
  lVar4 = lVar4 >> 2;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = pPVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::$_0>
                  ::operator()((_Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                                *)&local_40,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_00109118;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::$_0>
            ::operator()((_Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                          *)&local_40,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_00109118;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::$_0>
          ::operator()((_Iter_pred<jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                        *)&local_40,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar2) {
    _Var5._M_current = pPVar1;
  }
LAB_00109118:
  return _Var5._M_current == pPVar1;
}

Assistant:

bool isConsistent(const Alignment& a, SpanPair sp) {
  constexpr auto contains = [](IndexType p, Span s) {
    return p >= s.start && p < s.end;
  };
  return std::none_of(
      a.begin(),
      a.end(),
      [contains,sp](Point p) {
        return contains(p.src, sp.src) ^ contains(p.tgt, sp.tgt);
      });
}